

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4799b::BuildSystemTaskTests_staleFileRemoval_Test::TestBody
          (BuildSystemTaskTests_staleFileRemoval_Test *this)

{
  FileSystem this_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  FileSystem *pFVar6;
  pointer *__ptr;
  Child CVar7;
  Child *pCVar8;
  char *in_R9;
  long *plVar9;
  pointer *__ptr_2;
  pointer pcVar10;
  long lVar11;
  bool *pbVar12;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Str;
  StringRef path;
  StringRef mainFilename;
  StringRef Filename_00;
  StringRef Str_00;
  StringRef path_00;
  StringRef mainFilename_00;
  StringRef str;
  BuildSystem system_1;
  shared_ptr<(anonymous_namespace)::LoggingFileSystem> mockFS;
  BuildSystem system;
  error_code ec_1;
  BuildKey keyToBuild;
  MockBuildSystemDelegate delegate;
  SmallString<256U> builddb;
  SmallString<256U> manifest;
  TmpDir tempDir;
  Child local_5a8;
  Child CStack_5a0;
  long local_598;
  AssertHelper local_588;
  Child local_580;
  Child local_578;
  Child local_570 [2];
  FileSystem local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_558;
  BuildSystem local_550;
  Child local_548;
  long local_540;
  Child local_538 [2];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  bool *local_4e8 [2];
  bool local_4d8 [16];
  Child local_4c8;
  Child local_4c0;
  Child local_4b8 [2];
  Child local_4a8 [2];
  undefined1 local_498 [16];
  long *local_488 [2];
  long local_478 [2];
  undefined1 local_468 [16];
  char local_458;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_450;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_448;
  BuildKey local_440;
  Child local_420;
  long local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f0 [2];
  ExecutionQueueDelegate local_3b0 [2];
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  Child local_360;
  long local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [16];
  SmallVectorImpl<char> local_250;
  undefined1 local_240 [256];
  TmpDir local_140;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&local_140,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_360,&local_140);
  local_250.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_240;
  local_250.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_250.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_250,local_360.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_360.twine)->LHS)->_M_local_buf + local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.twine != local_350) {
    operator_delete(local_360.twine,local_350[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_360,"manifest.llbuild");
  llvm::Twine::Twine((Twine *)&local_420,"");
  llvm::Twine::Twine((Twine *)&local_548,"");
  llvm::Twine::Twine((Twine *)&local_4c8,"");
  llvm::sys::path::append
            (&local_250,(Twine *)&local_360,(Twine *)&local_420,(Twine *)&local_548,
             (Twine *)&local_4c8);
  local_420.twine = (Twine *)((ulong)(uint)local_420._4_4_ << 0x20);
  lVar3 = std::_V2::system_category();
  Filename.Length._0_4_ =
       local_250.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  Filename.Data =
       (char *)local_250.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  Filename.Length._4_4_ = 0;
  local_418 = lVar3;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_360,Filename,(error_code *)&local_420,F_Text);
  if (local_420.decUI != 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x216,
                  "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemoval_Test::TestBody()"
                 );
  }
  Str.Length = 0x90;
  Str.Data = 
  "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      description: STALE-FILE-REMOVAL\n      expectedOutputs: [\"a.out\"]\n"
  ;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_360,Str);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_360);
  str.Length = 3;
  str.Data = "C.1";
  llbuild::buildsystem::BuildKey::BuildKey(&local_440,'C',str);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_420,&local_140);
  local_360.twine = (Twine *)local_350;
  local_358 = 0x10000000000;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_360,local_420.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_420.twine)->LHS)->_M_local_buf + local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.twine != local_410) {
    operator_delete(local_420.twine,local_410[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_420,"build.db");
  pcVar10 = "";
  llvm::Twine::Twine((Twine *)&local_548,"");
  llvm::Twine::Twine((Twine *)&local_4c8,"");
  llvm::Twine::Twine((Twine *)&local_5a8,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_360,(Twine *)&local_420,(Twine *)&local_548,
             (Twine *)&local_4c8,(Twine *)&local_5a8);
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
            ((MockBuildSystemDelegate *)&local_420,true);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            ((BuildSystem *)&local_588,(BuildSystemDelegate *)&local_420,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_448);
  if (local_448._M_head_impl != (FileSystem *)0x0) {
    (*(local_448._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_448._M_head_impl = (FileSystem *)0x0;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_360);
  if (pcVar4 == (char *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = strlen(pcVar4);
  }
  path.Length = sVar5;
  path.Data = pcVar4;
  llbuild::buildsystem::BuildSystem::attachDB((BuildSystem *)&local_588,path,(string *)0x0);
  mainFilename.Length._0_4_ =
       local_250.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  mainFilename.Data =
       (char *)local_250.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  mainFilename.Length._4_4_ = 0;
  bVar1 = llbuild::buildsystem::BuildSystem::loadDescription((BuildSystem *)&local_588,mainFilename)
  ;
  local_4c8.character = bVar1;
  local_4c0.twine = (Twine *)0x0;
  if (bVar1) {
    local_380[0] = local_370;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_380,local_440.key.key._M_dataplus._M_p,
               local_440.key.key._M_dataplus._M_p + local_440.key.key._M_string_length);
    llbuild::buildsystem::BuildSystem::build
              ((Optional<llbuild::buildsystem::BuildValue> *)&local_548,(BuildSystem *)&local_588,
               (BuildKey *)local_380);
    if (local_380[0] != local_370) {
      operator_delete(local_380[0],local_370[0] + 1);
    }
    local_5a8.character = local_4d8[0];
    CStack_5a0.twine = (Twine *)0x0;
    if (local_4d8[0] == false) {
      testing::Message::Message((Message *)&local_578);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_4c8,(internal *)&local_5a8.character,
                 (AssertionResult *)"result.hasValue()","false","true",in_R9);
      iVar2 = 0x233;
LAB_0012bc35:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_560,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,iVar2,local_4c8.cString);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_560,(Message *)&local_578);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_560);
      CVar7 = local_578;
      if (&(local_4c8.twine)->LHS != local_4b8) {
        operator_delete(local_4c8.twine,CONCAT71(local_4b8[0]._1_7_,local_4b8[0].character) + 1);
        CVar7 = local_578;
      }
LAB_0012bc72:
      if (&(CVar7.twine)->LHS != (Child *)0x0) {
        (*(code *)((Twine *)*CVar7.decUL)->RHS)();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CStack_5a0.twine !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pCVar8 = &CStack_5a0;
        CVar7 = CStack_5a0;
LAB_0012bc8c:
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pCVar8->character,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CVar7.twine);
      }
    }
    else {
      local_5a8.character = local_548.decUI == 7;
      CStack_5a0.twine = (Twine *)0x0;
      if (local_548.decUI != 7) {
        testing::Message::Message((Message *)&local_578);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_4c8,(internal *)&local_5a8.character,
                   (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",in_R9)
        ;
        iVar2 = 0x234;
        goto LAB_0012bc35;
      }
      llbuild::buildsystem::BuildValue::getStaleFileList
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_4c8,
                 (BuildValue *)&local_548);
      local_578.twine = (Twine *)((long)local_4c0.twine - (long)local_4c8 >> 4);
      local_560._vptr_FileSystem = (_func_int **)0x1;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_5a8.character,"result.getValue().getStaleFileList().size()",
                 "1UL",(unsigned_long *)&local_578.decUI,(unsigned_long *)&local_560);
      if (&(local_4c8.twine)->LHS != (Child *)0x0) {
        operator_delete(local_4c8.twine,
                        CONCAT71(local_4b8[0]._1_7_,local_4b8[0].character) - (long)local_4c8);
      }
      if (local_5a8.character == '\0') {
        testing::Message::Message((Message *)&local_4c8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CStack_5a0.twine !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = ((_Alloc_hider *)&(CStack_5a0.stringRef)->Data)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_578,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x235,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)&local_4c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
        CVar7 = local_4c8;
        goto LAB_0012bc72;
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CStack_5a0.twine !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&CStack_5a0.character,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CStack_5a0.twine);
      }
      if (local_4d8[0] == false) {
LAB_0012c98c:
        __assert_fail("Storage.hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Optional.h"
                      ,0xb0,
                      "T *llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer() [T = llbuild::buildsystem::BuildValue]"
                     );
      }
      llbuild::buildsystem::BuildValue::getStaleFileList
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_5a8,
                 (BuildValue *)&local_548);
      pcVar4 = (local_5a8.stringRef)->Data;
      if (pcVar4 == (char *)0x0) {
        local_4c8.twine = (Twine *)local_4b8;
        local_4c0.twine = (Twine *)0x0;
        local_4b8[0].character = '\0';
      }
      else {
        local_4c8.twine = (Twine *)local_4b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4c8,pcVar4,
                   pcVar4 + *(size_t *)
                             &((local_5a8.smallString)->super_SmallVectorTemplateBase<char,_true>).
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                  );
      }
      CVar7 = local_4c8;
      iVar2 = strcmp(local_4c8.cString,"a.out");
      local_578.character = iVar2 == 0;
      local_570[0].twine = (Twine *)0x0;
      if (CVar7.twine != (Twine *)local_4b8) {
        operator_delete(CVar7.twine,CONCAT71(local_4b8[0]._1_7_,local_4b8[0].character) + 1);
      }
      if (local_5a8.twine != (Twine *)0x0) {
        operator_delete(local_5a8.twine,local_598 - (long)local_5a8);
      }
      pCVar8 = local_570;
      if (local_578.character != '\0') {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570[0].twine
            != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pCVar8->character,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_570[0].twine);
        }
        local_4c8.twine = (Twine *)local_4b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4c8,"commandPreparing(C.1)","");
        local_4a8[0].twine = (Twine *)local_498;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_4b8 + 2),"commandStarted(C.1)","");
        plVar9 = local_478;
        local_488[0] = plVar9;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_488,"commandFinished(C.1: 0)","");
        local_5a8.twine = (Twine *)0x0;
        CStack_5a0.twine = (Twine *)0x0;
        local_598 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_5a8,
                   &local_4c8,local_468);
        llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_578,(MockBuildSystemDelegate *)&local_420);
        testing::internal::
        CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((internal *)&local_560,
                   "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandFinished(C.1: 0)\", })"
                   ,"delegate.getMessages()",
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_5a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_578);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_578);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_5a8);
        lVar11 = -0x60;
        do {
          if (plVar9 != (long *)plVar9[-2]) {
            operator_delete((long *)plVar9[-2],*plVar9 + 1);
          }
          plVar9 = plVar9 + -4;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0);
        if (local_560._vptr_FileSystem._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_4c8);
          if (local_558 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_558->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_5a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                     ,0x23c,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_5a8,(Message *)&local_4c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
          if (&(local_4c8.twine)->LHS != (Child *)0x0) {
            (*(code *)((Twine *)*local_4c8.decUL)->RHS)();
          }
          if (local_558 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_558,local_558);
          }
          if (local_4d8[0] == true) {
            llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_548);
          }
          llbuild::buildsystem::BuildSystem::~BuildSystem((BuildSystem *)&local_588);
          llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
                    ((MockBuildSystemDelegate *)&local_420);
          goto LAB_0012bce1;
        }
        if (local_558 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_558,local_558);
        }
        if (local_4d8[0] == true) {
          llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_548);
        }
        llbuild::buildsystem::BuildSystem::~BuildSystem((BuildSystem *)&local_588);
        llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
                  ((MockBuildSystemDelegate *)&local_420);
        local_548.twine = (Twine *)((ulong)(uint)local_548._4_4_ << 0x20);
        Filename_00.Length._0_4_ =
             local_250.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        Filename_00.Data =
             (char *)local_250.super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        Filename_00.Length._4_4_ = 0;
        local_540 = lVar3;
        llvm::raw_fd_ostream::raw_fd_ostream
                  ((raw_fd_ostream *)&local_420,Filename_00,(error_code *)&local_548,F_Text);
        if (local_548.decUI != 0) {
          __assert_fail("!ec",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                        ,0x242,
                        "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemoval_Test::TestBody()"
                       );
        }
        Str_00.Length = 0x88;
        Str_00.Data = 
        "\nclient:\n  name: mock\n\ncommands:\n  C.1:\n    tool: stale-file-removal\n    description: STALE-FILE-REMOVAL\n    expectedOutputs: [\"b.out\"]\n"
        ;
        llvm::raw_ostream::operator<<((raw_ostream *)&local_420,Str_00);
        llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_420);
        std::make_shared<(anonymous_namespace)::LoggingFileSystem>();
        pFVar6 = (FileSystem *)operator_new(0x10);
        this_00._vptr_FileSystem = local_560._vptr_FileSystem;
        pFVar6->_vptr_FileSystem = (_func_int **)&PTR__FileSystem_0024e448;
        pFVar6[1]._vptr_FileSystem = local_560._vptr_FileSystem;
        llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
                  ((MockBuildSystemDelegate *)&local_420,true);
        local_450._M_head_impl = pFVar6;
        llbuild::buildsystem::BuildSystem::BuildSystem
                  (&local_550,(BuildSystemDelegate *)&local_420,
                   (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                    *)&local_450);
        if (local_450._M_head_impl != (FileSystem *)0x0) {
          (*(local_450._M_head_impl)->_vptr_FileSystem[1])();
        }
        local_450._M_head_impl = (FileSystem *)0x0;
        pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_360);
        if (pcVar4 == (char *)0x0) {
          sVar5 = 0;
        }
        else {
          sVar5 = strlen(pcVar4);
        }
        path_00.Length = sVar5;
        path_00.Data = pcVar4;
        llbuild::buildsystem::BuildSystem::attachDB(&local_550,path_00,(string *)0x0);
        mainFilename_00.Length._0_4_ =
             local_250.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        mainFilename_00.Data =
             (char *)local_250.super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        mainFilename_00.Length._4_4_ = 0;
        bVar1 = llbuild::buildsystem::BuildSystem::loadDescription(&local_550,mainFilename_00);
        local_4c8.character = bVar1;
        local_4c0.twine = (Twine *)0x0;
        if (bVar1) {
          local_3a0[0] = local_390;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,local_440.key.key._M_dataplus._M_p,
                     local_440.key.key._M_dataplus._M_p + local_440.key.key._M_string_length);
          llbuild::buildsystem::BuildSystem::build
                    ((Optional<llbuild::buildsystem::BuildValue> *)&local_4c8,&local_550,
                     (BuildKey *)local_3a0);
          if (local_3a0[0] != local_390) {
            operator_delete(local_3a0[0],local_390[0] + 1);
          }
          local_5a8.character = local_458;
          CStack_5a0.twine = (Twine *)0x0;
          if (local_458 == '\0') {
            testing::Message::Message((Message *)&local_578);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_548,(internal *)&local_5a8.character,
                       (AssertionResult *)"result.hasValue()","false","true",in_R9);
            iVar2 = 0x259;
LAB_0012c732:
            testing::internal::AssertHelper::AssertHelper
                      (&local_588,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,iVar2,local_548.cString);
            testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_578);
            testing::internal::AssertHelper::~AssertHelper(&local_588);
            CVar7 = local_578;
            if (&(local_548.twine)->LHS != local_538) {
              operator_delete(local_548.twine,(ulong)((long)&(local_538[0].twine)->LHS + 1));
              CVar7 = local_578;
            }
LAB_0012c769:
            if (&(CVar7.twine)->LHS != (Child *)0x0) {
              (*(code *)((Twine *)*CVar7.decUL)->RHS)();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CStack_5a0.twine !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pCVar8 = &CStack_5a0;
              local_580 = CStack_5a0;
LAB_0012c783:
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pCVar8->character,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_580.twine);
            }
          }
          else {
            local_5a8.character = local_4c8.decUI == 7;
            CStack_5a0.twine = (Twine *)0x0;
            if (local_4c8.decUI != 7) {
              testing::Message::Message((Message *)&local_578);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_548,(internal *)&local_5a8.character,
                         (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",
                         in_R9);
              iVar2 = 0x25a;
              goto LAB_0012c732;
            }
            llbuild::buildsystem::BuildValue::getStaleFileList
                      ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_548,
                       (BuildValue *)&local_4c8);
            local_578.twine = (Twine *)(local_540 - (long)local_548 >> 4);
            local_588.data_ = (AssertHelperData *)0x1;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&local_5a8.character,
                       "result.getValue().getStaleFileList().size()","1UL",
                       (unsigned_long *)&local_578.decUI,(unsigned_long *)&local_588);
            if (&(local_548.twine)->LHS != (Child *)0x0) {
              operator_delete(local_548.twine,(long)local_538[0].twine - (long)local_548);
            }
            if (local_5a8.character == '\0') {
              testing::Message::Message((Message *)&local_548);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CStack_5a0.twine ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar10 = "";
              }
              else {
                pcVar10 = ((_Alloc_hider *)&(CStack_5a0.stringRef)->Data)->_M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_578,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,0x25b,pcVar10);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_578,(Message *)&local_548);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
              CVar7 = local_548;
              goto LAB_0012c769;
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CStack_5a0.twine !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&CStack_5a0.character,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CStack_5a0.twine);
            }
            if (local_458 == '\0') goto LAB_0012c98c;
            llbuild::buildsystem::BuildValue::getStaleFileList
                      ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_5a8,
                       (BuildValue *)&local_4c8);
            llvm::StringRef::str_abi_cxx11_((string *)&local_548,local_5a8.stringRef);
            CVar7 = local_548;
            iVar2 = strcmp(local_548.cString,"b.out");
            local_578.character = iVar2 == 0;
            local_570[0].twine = (Twine *)0x0;
            if (CVar7.twine != (Twine *)local_538) {
              operator_delete(CVar7.twine,(ulong)((long)&(local_538[0].twine)->LHS + 1));
            }
            if (local_5a8.twine != (Twine *)0x0) {
              operator_delete(local_5a8.twine,local_598 - (long)local_5a8);
            }
            pCVar8 = local_570;
            if (local_578.character == '\0') {
              testing::Message::Message((Message *)&local_5a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_548,(internal *)&local_578.character,
                         (AssertionResult *)
                         "strcmp(result.getValue().getStaleFileList()[0].str().c_str(), \"b.out\") == 0"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_588,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,0x25c,local_548.cString);
              testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_5a8);
              testing::internal::AssertHelper::~AssertHelper(&local_588);
              if (local_548.twine != (Twine *)local_538) {
                operator_delete(local_548.twine,(ulong)((long)&(local_538[0].twine)->LHS + 1));
              }
              if (local_5a8.twine != (Twine *)0x0) {
                (**(code **)(*local_5a8.decUL + 8))();
              }
              local_580 = local_570[0];
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_570[0].twine ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
              goto LAB_0012c788;
              goto LAB_0012c783;
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_570[0].twine !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pCVar8->character,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_570[0].twine);
            }
            local_548.twine = (Twine *)local_538;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"a.out","");
            local_5a8.twine = (Twine *)0x0;
            CStack_5a0.twine = (Twine *)0x0;
            local_598 = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_5a8,&local_548,local_528);
            (anonymous_namespace)::LoggingFileSystem::getDeletedPaths_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_578,this_00._vptr_FileSystem);
            testing::internal::
            CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((internal *)&local_588,"std::vector<std::string>({ \"a.out\" })",
                       "mockFS->getDeletedPaths()",
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_5a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_578);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_578);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_5a8);
            if (local_548.twine != (Twine *)local_538) {
              operator_delete(local_548.twine,(ulong)((long)&(local_538[0].twine)->LHS + 1));
            }
            if (local_588.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_548);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_580.twine ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = ((_Alloc_hider *)&(local_580.stringRef)->Data)->_M_p;
              }
              iVar2 = 0x25e;
LAB_0012c92a:
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_5a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,iVar2,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_5a8,(Message *)&local_548);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_5a8);
              if (&(local_548.twine)->LHS != (Child *)0x0) {
                (*(code *)((Twine *)*local_548.decUL)->RHS)();
              }
            }
            else {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_580.twine !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_580.character,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_580.twine);
              }
              local_548.twine = (Twine *)local_538;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_548,"commandPreparing(C.1)","");
              local_528[0] = local_518;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_528,"commandStarted(C.1)","");
              local_508[0] = local_4f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_508,"commandNote(C.1) Removed stale file \'a.out\'\n","");
              pbVar12 = local_4d8;
              local_4e8[0] = pbVar12;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_4e8,"commandFinished(C.1: 0)","");
              local_5a8.twine = (Twine *)0x0;
              CStack_5a0.twine = (Twine *)0x0;
              local_598 = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_5a8,&local_548,&local_4c8);
              llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_578,(MockBuildSystemDelegate *)&local_420);
              testing::internal::
              CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((internal *)&local_588,
                         "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandNote(C.1) Removed stale file \'a.out\'\\n\", \"commandFinished(C.1: 0)\", })"
                         ,"delegate.getMessages()",
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_5a8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_578);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_578);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_5a8);
              lVar3 = -0x80;
              do {
                if (pbVar12 != *(bool **)(pbVar12 + -0x10)) {
                  operator_delete(*(bool **)(pbVar12 + -0x10),*(long *)pbVar12 + 1);
                }
                pbVar12 = pbVar12 + -0x20;
                lVar3 = lVar3 + 0x20;
              } while (lVar3 != 0);
              if (local_588.data_._0_1_ == (internal)0x0) {
                testing::Message::Message((Message *)&local_548);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_580.twine ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = ((_Alloc_hider *)&(local_580.stringRef)->Data)->_M_p;
                }
                iVar2 = 0x265;
                goto LAB_0012c92a;
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580.twine
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pCVar8 = &local_580;
              goto LAB_0012c783;
            }
          }
LAB_0012c788:
          if (local_458 == '\x01') {
            llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_4c8);
          }
        }
        else {
          testing::Message::Message((Message *)&local_5a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&local_548,(internal *)&local_4c8.character,
                     (AssertionResult *)"loadingResult","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_578,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                     ,0x256,local_548.cString);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_578,(Message *)&local_5a8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
          if (&(local_548.twine)->LHS != local_538) {
            operator_delete(local_548.twine,(ulong)((long)&(local_538[0].twine)->LHS + 1));
          }
          if (local_5a8.twine != (Twine *)0x0) {
            (**(code **)(*local_5a8.decUL + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0.twine
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4c0.character,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c0.twine);
          }
        }
        llbuild::buildsystem::BuildSystem::~BuildSystem(&local_550);
        llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
                  ((MockBuildSystemDelegate *)&local_420);
        if (local_558 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558);
        }
        goto LAB_0012bce1;
      }
      testing::Message::Message((Message *)&local_5a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_4c8,(internal *)&local_578.character,
                 (AssertionResult *)
                 "strcmp(result.getValue().getStaleFileList()[0].str().c_str(), \"a.out\") == 0",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_560,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x236,local_4c8.cString);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_560,(Message *)&local_5a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_560);
      if (local_4c8.twine != (Twine *)local_4b8) {
        operator_delete(local_4c8.twine,CONCAT71(local_4b8[0]._1_7_,local_4b8[0].character) + 1);
      }
      if (local_5a8.twine != (Twine *)0x0) {
        (**(code **)(*local_5a8.decUL + 8))();
      }
      CVar7 = local_570[0];
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_570[0].twine !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0012bc8c;
    }
    if (local_4d8[0] == true) {
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_548);
    }
  }
  else {
    testing::Message::Message((Message *)&local_5a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_548,(internal *)&local_4c8.character,
               (AssertionResult *)"loadingResult","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x22f,local_548.cString);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if (&(local_548.twine)->LHS != local_538) {
      operator_delete(local_548.twine,(ulong)((long)&(local_538[0].twine)->LHS + 1));
    }
    if (local_5a8.twine != (Twine *)0x0) {
      (**(code **)(*local_5a8.decUL + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0.twine !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_4c0.character,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4c0.twine);
    }
  }
  llbuild::buildsystem::BuildSystem::~BuildSystem((BuildSystem *)&local_588);
  local_420.twine = (Twine *)&PTR__MockBuildSystemDelegate_0024e788;
  llbuild::basic::ExecutionQueueDelegate::~ExecutionQueueDelegate(local_3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_3f0);
  llbuild::buildsystem::BuildSystemDelegate::~BuildSystemDelegate((BuildSystemDelegate *)&local_420)
  ;
LAB_0012bce1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.twine != local_350) {
    free(local_360.twine);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440.key.key._M_dataplus._M_p != &local_440.key.key.field_2) {
    operator_delete(local_440.key.key._M_dataplus._M_p,
                    local_440.key.key.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)
      local_250.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_240) {
    free(local_250.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  llbuild::TmpDir::~TmpDir(&local_140);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, staleFileRemoval) {
  TmpDir tempDir(__func__);

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      description: STALE-FILE-REMOVAL
      expectedOutputs: ["a.out"]
)END";
  }

  auto keyToBuild = BuildKey::makeCommand("C.1");

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");

  {
    MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);

    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    auto result = system.build(keyToBuild);

    ASSERT_TRUE(result.hasValue());
    ASSERT_TRUE(result.getValue().isStaleFileRemoval());
    ASSERT_EQ(result.getValue().getStaleFileList().size(), 1UL);
    ASSERT_TRUE(strcmp(result.getValue().getStaleFileList()[0].str().c_str(), "a.out") == 0);

    ASSERT_EQ(std::vector<std::string>({
      "commandPreparing(C.1)",
      "commandStarted(C.1)",
      "commandFinished(C.1: 0)",
    }), delegate.getMessages());
  }

  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
  C.1:
    tool: stale-file-removal
    description: STALE-FILE-REMOVAL
    expectedOutputs: ["b.out"]
)END";
  }

  auto mockFS = std::make_shared<LoggingFileSystem>();
  std::unique_ptr<FileSystem> wrapFS(new FileSystemReferenceWrapper(*mockFS));
  MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
  BuildSystem system(delegate, std::move(wrapFS));
  system.attachDB(builddb.c_str(), nullptr);
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);
  auto result = system.build(keyToBuild);

  ASSERT_TRUE(result.hasValue());
  ASSERT_TRUE(result.getValue().isStaleFileRemoval());
  ASSERT_EQ(result.getValue().getStaleFileList().size(), 1UL);
  ASSERT_TRUE(strcmp(result.getValue().getStaleFileList()[0].str().c_str(), "b.out") == 0);

  ASSERT_EQ(std::vector<std::string>({ "a.out" }), mockFS->getDeletedPaths());

  ASSERT_EQ(std::vector<std::string>({
    "commandPreparing(C.1)",
    "commandStarted(C.1)",
    "commandNote(C.1) Removed stale file 'a.out'\n",
    "commandFinished(C.1: 0)",
  }), delegate.getMessages());
}